

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref cashew::ValueBuilder::makeNew(Ref call)

{
  Ref RVar1;
  Ref r;
  Value *this;
  
  RVar1 = makeRawArray(2);
  r = makeRawString((IString *)NEW);
  this = cashew::Value::push_back(RVar1.inst,r);
  RVar1.inst = cashew::Value::push_back(this,call);
  return (Ref)RVar1.inst;
}

Assistant:

static Ref makeNew(Ref call) {
    return &makeRawArray(2)->push_back(makeRawString(NEW)).push_back(call);
  }